

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O1

CECoordinates * __thiscall
CECoordinates::GetObservedCoords
          (CECoordinates *__return_storage_ptr__,CECoordinates *this,CEDate *date,
          CEObserver *observer)

{
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  local_58 = CEDate::operator_cast_to_double(date);
  local_60 = CEObserver::Longitude_Rad(observer);
  local_68 = CEObserver::Latitude_Rad(observer);
  local_70 = CEObserver::Elevation_m(observer);
  local_78 = CEObserver::Pressure_hPa(observer);
  local_80 = CEObserver::Temperature_C(observer);
  local_88 = CEObserver::RelativeHumidity(observer);
  local_38 = CEDate::dut1(date);
  local_40 = CEDate::xpolar(date);
  local_48 = CEDate::ypolar(date);
  local_50 = CEObserver::Wavelength_um(observer);
  (*this->_vptr_CECoordinates[9])
            (__return_storage_ptr__,this,&local_58,&local_60,&local_68,&local_70,&local_78,&local_80
             ,&local_88,&local_38,&local_40,&local_48,&local_50);
  return __return_storage_ptr__;
}

Assistant:

CECoordinates CECoordinates::GetObservedCoords(const CEDate& date,
                                               const CEObserver& observer) const
{
    return GetObservedCoords(date,
                             observer.Longitude_Rad(),
                             observer.Latitude_Rad(),
                             observer.Elevation_m(),
                             observer.Pressure_hPa(),
                             observer.Temperature_C(),
                             observer.RelativeHumidity(),
                             date.dut1(), 
                             date.xpolar(), 
                             date.ypolar(), 
                             observer.Wavelength_um());
}